

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# condexe.cc
# Opt level: O1

void __thiscall ConditionMarker::ConditionMarker(ConditionMarker *this)

{
  this->bool3vn = (Varnode *)0x0;
  this->binaryop = (PcodeOp *)0x0;
  this->boolvn = (Varnode *)0x0;
  this->bool2vn = (Varnode *)0x0;
  this->initop = (PcodeOp *)0x0;
  this->basevn = (Varnode *)0x0;
  return;
}

Assistant:

ConditionMarker::ConditionMarker(void)

{
  initop = (PcodeOp *)0;
  basevn = (Varnode *)0;
  boolvn = (Varnode *)0;
  bool2vn = (Varnode *)0;
  bool3vn = (Varnode *)0;
  binaryop = (PcodeOp *)0;
}